

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::SimdShuffleOpExpr,_std::default_delete<wabt::SimdShuffleOpExpr>_> __thiscall
wabt::MakeUnique<wabt::SimdShuffleOpExpr,wabt::Opcode&,v128&>(wabt *this,Opcode *args,v128 *args_1)

{
  v128 val;
  SimdShuffleOpExpr *this_00;
  Location local_58;
  undefined8 local_34;
  undefined8 local_2c;
  Opcode local_24;
  v128 *local_20;
  v128 *args_local_1;
  Opcode *args_local;
  
  local_20 = args_1;
  args_local_1 = (v128 *)args;
  args_local = (Opcode *)this;
  this_00 = (SimdShuffleOpExpr *)operator_new(0x50);
  local_24.enum_ = *(Enum *)args_local_1->v;
  local_34 = *(undefined8 *)local_20->v;
  local_2c = *(undefined8 *)(local_20->v + 8);
  Location::Location(&local_58);
  val.v[8] = (undefined1)local_2c;
  val.v[9] = local_2c._1_1_;
  val.v[10] = local_2c._2_1_;
  val.v[0xb] = local_2c._3_1_;
  val.v[0xc] = local_2c._4_1_;
  val.v[0xd] = local_2c._5_1_;
  val.v[0xe] = local_2c._6_1_;
  val.v[0xf] = local_2c._7_1_;
  val.v[0] = (undefined1)local_34;
  val.v[1] = local_34._1_1_;
  val.v[2] = local_34._2_1_;
  val.v[3] = local_34._3_1_;
  val.v[4] = local_34._4_1_;
  val.v[5] = local_34._5_1_;
  val.v[6] = local_34._6_1_;
  val.v[7] = local_34._7_1_;
  SimdShuffleOpExpr::SimdShuffleOpExpr(this_00,local_24,val,&local_58);
  std::unique_ptr<wabt::SimdShuffleOpExpr,std::default_delete<wabt::SimdShuffleOpExpr>>::
  unique_ptr<std::default_delete<wabt::SimdShuffleOpExpr>,void>
            ((unique_ptr<wabt::SimdShuffleOpExpr,std::default_delete<wabt::SimdShuffleOpExpr>> *)
             this,this_00);
  return (__uniq_ptr_data<wabt::SimdShuffleOpExpr,_std::default_delete<wabt::SimdShuffleOpExpr>,_true,_true>
          )(__uniq_ptr_data<wabt::SimdShuffleOpExpr,_std::default_delete<wabt::SimdShuffleOpExpr>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}